

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputTokenizer.h
# Opt level: O0

void __thiscall InputTokenizer::Lexeme::~Lexeme(Lexeme *this)

{
  Lexeme *this_local;
  
  ~Lexeme(this);
  operator_delete(this);
  return;
}

Assistant:

virtual ~Lexeme() {}